

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

PyObject * pybind11::detail::dict_getitemstringref(PyObject *v,char *key)

{
  PyObject *op;
  long lVar1;
  error_already_set *this;
  PyObject *rv;
  char *key_local;
  PyObject *v_local;
  
  op = dict_getitemstring(v,key);
  if (op == (PyObject *)0x0) {
    lVar1 = PyErr_Occurred();
    if (lVar1 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x18);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  _Py_XINCREF(op);
  return op;
}

Assistant:

inline PyObject *dict_getitemstringref(PyObject *v, const char *key) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject *rv;
    if (PyDict_GetItemStringRef(v, key, &rv) < 0) {
        throw error_already_set();
    }
    return rv;
#else
    PyObject *rv = dict_getitemstring(v, key);
    if (rv == nullptr && PyErr_Occurred()) {
        throw error_already_set();
    }
    Py_XINCREF(rv);
    return rv;
#endif
}